

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O2

void * delay_new(t_symbol *unitname,t_floatarg f,t_floatarg tempo)

{
  t_delay *x;
  _clock *p_Var1;
  t_symbol *ptVar2;
  t_symbol *s2;
  float fVar3;
  
  x = (t_delay *)pd_new(delay_class);
  fVar3 = 0.0;
  if (0.0 <= f) {
    fVar3 = f;
  }
  x->x_deltime = (double)fVar3;
  p_Var1 = clock_new(x,delay_tick);
  x->x_clock = p_Var1;
  ptVar2 = gensym("bang");
  outlet_new((t_object *)x,ptVar2);
  ptVar2 = gensym("float");
  s2 = gensym("ft1");
  inlet_new((t_object *)x,(t_pd *)x,ptVar2,s2);
  if ((tempo != 0.0) || (NAN(tempo))) {
    delay_tempo(x,unitname,tempo);
  }
  return x;
}

Assistant:

static void *delay_new(t_symbol *unitname, t_floatarg f, t_floatarg tempo)
{
    t_delay *x = (t_delay *)pd_new(delay_class);
    delay_ft1(x, f);
    x->x_clock = clock_new(x, (t_method)delay_tick);
    outlet_new(&x->x_obj, gensym("bang"));
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    if (tempo != 0)
        delay_tempo(x, unitname, tempo);
    return (x);
}